

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfChannelList.cpp
# Opt level: O0

void __thiscall Imf_3_4::ChannelList::insert(ChannelList *this,char *name,Channel *channel)

{
  undefined8 uVar1;
  ArgExc *this_00;
  mapped_type *pmVar2;
  char *in_RDX;
  char *in_RSI;
  stringstream _iex_throw_s;
  Name *in_stack_fffffffffffffd40;
  key_type *in_stack_fffffffffffffd78;
  map<Imf_3_4::Name,_Imf_3_4::Channel,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Channel>_>_>
  *in_stack_fffffffffffffd80;
  stringstream local_1a0 [16];
  ostream local_190 [400];
  
  if (*in_RSI == '\0') {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_1a0);
    std::operator<<(local_190,"Image channel name cannot be an empty string.");
    this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc(this_00,local_1a0);
    __cxa_throw(this_00,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
  }
  Name::Name(in_stack_fffffffffffffd40,in_RDX);
  pmVar2 = std::
           map<Imf_3_4::Name,_Imf_3_4::Channel,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Channel>_>_>
           ::operator[](in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
  uVar1 = *(undefined8 *)in_RDX;
  pmVar2->type = (int)uVar1;
  pmVar2->xSampling = (int)((ulong)uVar1 >> 0x20);
  pmVar2->ySampling = *(int *)(in_RDX + 8);
  pmVar2->pLinear = (bool)in_RDX[0xc];
  return;
}

Assistant:

void
ChannelList::insert (const char name[], const Channel& channel)
{
    if (name[0] == 0)
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Image channel name cannot be an empty string.");

    _map[name] = channel;
}